

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

ArrayXZ * __thiscall
IMLE<1,_1,_FastLinearExpert>::getMultiplePredictionsJacobian(IMLE<1,_1,_FastLinearExpert> *this)

{
  reference pFVar1;
  reference piVar2;
  Scalar *pSVar3;
  NoAlias<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::MatrixBase> other;
  DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_> matrix;
  long in_RDI;
  Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>
  PVar4;
  Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>
  PVar5;
  int k;
  int j_1;
  int j;
  Mat weightedKappa;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffff788;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffff790;
  DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *this_00;
  LhsNested in_stack_fffffffffffff798;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff7a0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_fffffffffffff7a8;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffff7b0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_fffffffffffff7b8;
  StorageBaseType *in_stack_fffffffffffff7d0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  *in_stack_fffffffffffff7d8;
  undefined4 local_70c;
  undefined4 local_bc;
  undefined4 local_3c;
  
  if ((*(byte *)(in_RDI + 600) & 1) == 0) {
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::clear((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             *)0x27d050);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::clear((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             *)0x27d064);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::resize((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)in_stack_fffffffffffff7b0,(size_type)in_stack_fffffffffffff7a8,
             (value_type *)in_stack_fffffffffffff7a0);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::resize((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)in_stack_fffffffffffff7b0,(size_type)in_stack_fffffffffffff7a8,
             (value_type *)in_stack_fffffffffffff7a0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               in_stack_fffffffffffff7b0,(Index)in_stack_fffffffffffff7a8,
               (Index)in_stack_fffffffffffff7a0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((Index)in_stack_fffffffffffff798.m_diagonal,(Index)in_stack_fffffffffffff790);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff790,
               in_stack_fffffffffffff788);
    for (local_3c = 0; local_3c < *(int *)(in_RDI + 0xb0); local_3c = local_3c + 1) {
      pFVar1 = std::
               vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                             *)(in_RDI + 0x98),(long)local_3c);
      LinearExpert<1,_1>::get_p_z(&pFVar1->super_LinearExpert<1,_1>);
      pFVar1 = std::
               vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                             *)(in_RDI + 0x98),(long)local_3c);
      LinearExpert<1,_1>::getKappa(&pFVar1->super_LinearExpert<1,_1>);
      Eigen::operator*((double *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_3c);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff7a0,(Index)in_stack_fffffffffffff798.m_diagonal);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator+=
                (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    }
    for (local_bc = 0; PVar5.m_rhs = (RhsNested)in_stack_fffffffffffff790,
        PVar5.m_lhs.m_diagonal = in_stack_fffffffffffff798.m_diagonal,
        local_bc < *(int *)(in_RDI + 0xb0); local_bc = local_bc + 1) {
      pFVar1 = std::
               vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                             *)(in_RDI + 0x98),(long)local_bc);
      LinearExpert<1,_1>::get_p_z(&pFVar1->super_LinearExpert<1,_1>);
      pFVar1 = std::
               vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                             *)(in_RDI + 0x98),(long)local_bc);
      LinearExpert<1,_1>::get_dGamma(&pFVar1->super_LinearExpert<1,_1>);
      Eigen::operator*((double *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_bc);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                (in_stack_fffffffffffff790,(Index)in_stack_fffffffffffff788);
      pFVar1 = std::
               vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                             *)(in_RDI + 0x98),(long)local_bc);
      LinearExpert<1,_1>::getKappa(&pFVar1->super_LinearExpert<1,_1>);
      Eigen::operator*((double *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>>
      ::operator+(in_stack_fffffffffffff7b8,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)in_stack_fffffffffffff7b0);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_bc);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff7a0,(Index)in_stack_fffffffffffff798.m_diagonal);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const>>
      ::operator-((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                   *)in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                (in_stack_fffffffffffff790,(Index)in_stack_fffffffffffff788);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
      ::operator/(in_stack_fffffffffffff7d8,(double *)in_stack_fffffffffffff7d0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff7a0,(Index)in_stack_fffffffffffff798.m_diagonal);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                 in_stack_fffffffffffff790,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                  *)in_stack_fffffffffffff788);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff7a0,(Index)in_stack_fffffffffffff798.m_diagonal);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      asDiagonal((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffff790);
      std::
      vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
      ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                    *)(in_RDI + 0x98),(long)local_bc);
      Eigen::
      DiagonalBase<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
      ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                   *)in_stack_fffffffffffff7a0,
                  (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                  in_stack_fffffffffffff798.m_diagonal);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff7a0,(Index)in_stack_fffffffffffff798.m_diagonal);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff7a0,(Index)in_stack_fffffffffffff798.m_diagonal);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                in_stack_fffffffffffff790);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffff7a0,
                 (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)in_stack_fffffffffffff798.m_diagonal);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>,Eigen::Matrix<double,1,1,0,1,1>,1>>
      ::operator-((MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
                   *)in_stack_fffffffffffff7b8,
                  (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>
                   *)in_stack_fffffffffffff7b0);
      piVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_bc);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                    *)(in_RDI + 0x1f0),(long)*piVar2);
      Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::noalias
                ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffff788);
      Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::MatrixBase> *)
                 in_stack_fffffffffffff7b0,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>,_const_Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>_>
                  *)in_stack_fffffffffffff7a8);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff7a0,(Index)in_stack_fffffffffffff798.m_diagonal);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffff7a0,(Index)in_stack_fffffffffffff798.m_diagonal);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                in_stack_fffffffffffff790);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffff7a0,
                 (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)in_stack_fffffffffffff798.m_diagonal);
      piVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_bc);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                    *)(in_RDI + 0x208),(long)*piVar2);
      Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::noalias
                ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffff788);
      Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::MatrixBase> *)
                 in_stack_fffffffffffff7b0,
                 (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>
                  *)in_stack_fffffffffffff7a8);
    }
    for (local_70c = 0; local_70c < *(int *)(in_RDI + 0x254); local_70c = local_70c + 1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)PVar5.m_rhs,
                          (Index)in_stack_fffffffffffff788);
      if ((*pSVar3 != 0.0) || (NAN(*pSVar3))) {
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x1a8),(long)local_70c);
        Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::asDiagonal
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffff788);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x208),(long)local_70c);
        PVar4 = Eigen::DiagonalBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,1,1,0,1,1>const>>::
                operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                           *)PVar5.m_rhs,
                          (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                          in_stack_fffffffffffff788);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x1f0),(long)local_70c);
        other = Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::noalias
                          ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                           in_stack_fffffffffffff788);
        Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::MatrixBase> *)PVar4.m_rhs,
                   (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
                    *)other.m_expression);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x1c0),(long)local_70c);
        this_00 = (DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)PVar5.m_rhs;
        matrix = Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::asDiagonal
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                            in_stack_fffffffffffff788);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x1f0),(long)local_70c);
        PVar5 = Eigen::DiagonalBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,1,1,0,1,1>const>>::
                operator*(this_00,(MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                                  in_stack_fffffffffffff788);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x1f0),(long)local_70c);
        Eigen::Matrix<double,1,1,0,1,1>::operator=
                  (PVar5.m_rhs,
                   (DenseBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
                    *)in_stack_fffffffffffff788);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x1c0),(long)local_70c);
        Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::cwiseAbs2
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)other.m_expression);
        Eigen::
        MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::asDiagonal((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)PVar5.m_lhs.m_diagonal.m_diagonal);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x208),(long)local_70c);
        Eigen::
        DiagonalBase<Eigen::DiagonalWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
        ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                     *)other.m_expression,
                    (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)matrix.m_diagonal);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x208),(long)local_70c);
        Eigen::Matrix<double,1,1,0,1,1>::operator=
                  (PVar5.m_rhs,
                   (DenseBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
                    *)in_stack_fffffffffffff788);
      }
      else {
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x1f0),(long)local_70c);
        Eigen::Matrix<double,_1,_1,_0,_1,_1>::operator=
                  (PVar5.m_rhs,(Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffff788);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x208),(long)local_70c);
        Eigen::Matrix<double,_1,_1,_0,_1,_1>::operator=
                  (PVar5.m_rhs,(Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffff788);
      }
    }
    *(undefined1 *)(in_RDI + 600) = 1;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x27da7c)
    ;
  }
  return (ArrayXZ *)(in_RDI + 0x1f0);
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::ArrayXZ const &IMLE_base::getMultiplePredictionsJacobian()
{
    if( !hasPredJacobian )
    {
        predictionsJacobian.clear();
        predictionsVarJacobian.clear();
        predictionsJacobian.resize(nSolFound, zeroXZ);
        predictionsVarJacobian.resize(nSolFound, zeroXZ);
        zeta.resize(d,M);

        Mat weightedKappa = Mat::Zero(d,nSolFound);
        for( int j = 0; j < M; j++ )
            weightedKappa.col(sNearest[j]) += experts[j].get_p_z() * experts[j].getKappa();

        for( int j = 0; j < M; j++ )
        {
            zeta.col(j) = (experts[j].get_p_z() * experts[j].get_dGamma() + sumW(sNearest[j]) * experts[j].getKappa() - weightedKappa.col(sNearest[j])) / varPhiAuxj(j);

            predictionsJacobian[sNearest[j]].noalias() += fInvRj.col(j).asDiagonal() * experts[j].Lambda - invRxj.col(j) * zeta.col(j).transpose();
            predictionsVarJacobian[sNearest[j]].noalias() += fInvRj.col(j) * zeta.col(j).transpose();
        }

        for( int k = 0; k < nSolFound; k++ )
            if(sum_p_z(k) == 0.0)  // Not likely, but...
            {
                predictionsJacobian[k] = zeroXZ;
                predictionsVarJacobian[k] = infinityXZ;
            }
            else
            {
                predictionsJacobian[k].noalias() += predictions[k].asDiagonal() * predictionsVarJacobian[k];
                predictionsJacobian[k] = predictionsVar[k].asDiagonal() * predictionsJacobian[k];
                predictionsVarJacobian[k] = predictionsVar[k].cwiseAbs2().asDiagonal() * predictionsVarJacobian[k];
            }

        hasPredJacobian = true;
    }

    return predictionsJacobian;
}